

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int64_t av1_block_error_c(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz)

{
  int diff;
  int64_t sqcoeff;
  int64_t error;
  int i;
  int64_t *ssz_local;
  intptr_t block_size_local;
  tran_low_t *dqcoeff_local;
  tran_low_t *coeff_local;
  
  error = 0;
  sqcoeff = 0;
  for (i = 0; i < block_size; i = i + 1) {
    error = (coeff[i] - dqcoeff[i]) * (coeff[i] - dqcoeff[i]) + error;
    sqcoeff = coeff[i] * coeff[i] + sqcoeff;
  }
  *ssz = sqcoeff;
  return error;
}

Assistant:

int64_t av1_block_error_c(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                          intptr_t block_size, int64_t *ssz) {
  int i;
  int64_t error = 0, sqcoeff = 0;

  for (i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
    sqcoeff += coeff[i] * coeff[i];
  }

  *ssz = sqcoeff;
  return error;
}